

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O2

_Bool progress_meter(GlobalConfig *global,curltime *start,_Bool final)

{
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  byte bVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  FILE *pFVar10;
  timediff_t tVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  curl_off_t cVar15;
  ulong uVar16;
  per_transfer **pppVar17;
  curl_off_t cVar18;
  char *pcVar19;
  long lVar20;
  curl_off_t bytes;
  curl_off_t bytes_00;
  double dVar21;
  curltime cVar22;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  char ulpercen [4];
  char dlpercen [4];
  char time_total [10];
  char time_left [10];
  char buffer [3] [6];
  char time_spent [10];
  
  if ((global->field_0x64 & 3) != 0) {
    return false;
  }
  cVar22 = curlx_now();
  auVar1 = cVar22._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  older.tv_usec = progress_meter_stamp_1;
  older.tv_sec = progress_meter_stamp_0;
  older._12_4_ = 0;
  tVar11 = curlx_timediff(newer,older);
  if (progress_meter_header == '\0') {
    progress_meter_header = '\x01';
    fputs("DL% UL%  Dled  Uled  Xfers  Live Total     Current  Left    Speed\n",(FILE *)tool_stderr)
    ;
  }
  if ((!final) && (tVar11 < 0x1f5)) {
    return false;
  }
  uVar2 = start->tv_sec;
  uVar3 = start->tv_usec;
  older_00.tv_usec = uVar3;
  older_00.tv_sec = uVar2;
  newer_00._12_4_ = 0;
  newer_00.tv_sec = auVar1._0_8_;
  newer_00.tv_usec = auVar1._8_4_;
  older_00._12_4_ = 0;
  tVar11 = curlx_timediff(newer_00,older_00);
  dlpercen[0] = '-';
  dlpercen[1] = '-';
  dlpercen[2] = '\0';
  dlpercen[3] = '\0';
  ulpercen[0] = '-';
  ulpercen[1] = '-';
  ulpercen[2] = '\0';
  ulpercen[3] = '\0';
  pppVar17 = &transfers;
  bVar7 = 1;
  lVar20 = 0;
  bVar4 = 1;
  cVar15 = all_ultotal;
  cVar18 = all_dltotal;
  bytes = all_ulalready;
  bytes_00 = all_dlalready;
  progress_meter_stamp_0 = cVar22.tv_sec;
  progress_meter_stamp_1 = cVar22.tv_usec;
  while (pppVar17 = &((per_transfer *)pppVar17)->next->next,
        (per_transfer *)pppVar17 != (per_transfer *)0x0) {
    if (((per_transfer *)pppVar17)->dltotal == 0) {
      bVar7 = 0;
    }
    else if ((((per_transfer *)pppVar17)->field_0x1c0 & 1) == 0) {
      cVar18 = cVar18 + ((per_transfer *)pppVar17)->dltotal;
      all_dltotal = cVar18;
      ((per_transfer *)pppVar17)->field_0x1c0 = ((per_transfer *)pppVar17)->field_0x1c0 | 1;
    }
    if (((per_transfer *)pppVar17)->ultotal == 0) {
      bVar4 = 0;
    }
    else if ((((per_transfer *)pppVar17)->field_0x1c0 & 2) == 0) {
      cVar15 = cVar15 + ((per_transfer *)pppVar17)->ultotal;
      all_ultotal = cVar15;
      ((per_transfer *)pppVar17)->field_0x1c0 = ((per_transfer *)pppVar17)->field_0x1c0 | 2;
    }
    bytes_00 = bytes_00 + ((per_transfer *)pppVar17)->dlnow;
    bytes = bytes + ((per_transfer *)pppVar17)->ulnow;
    lVar20 = lVar20 + (ulong)(((byte)((per_transfer *)pppVar17)->field_0x1d8 >> 3 & 1) != 0);
  }
  if ((bool)(cVar18 != 0 & bVar7)) {
    if (bytes_00 < 0x147ae147ae147ae) {
      lVar12 = (bytes_00 * 100) / cVar18;
    }
    else {
      lVar12 = bytes_00 / (cVar18 / 100);
    }
    curl_msnprintf(dlpercen,4,"%3ld",lVar12);
    cVar15 = all_ultotal;
  }
  if ((bool)(bVar4 & cVar15 != 0)) {
    if (bytes < 0x147ae147ae147ae) {
      lVar12 = bytes * 100;
    }
    else {
      cVar15 = cVar15 / 100;
      lVar12 = bytes;
    }
    curl_msnprintf(ulpercen,4,"%3ld",lVar12 / cVar15);
  }
  uVar16 = (ulong)speedindex;
  speedindex = speedindex + 1;
  speedstore[uVar16].dl = bytes_00;
  speedstore[uVar16].ul = bytes;
  speedstore[uVar16].stamp.tv_sec = cVar22.tv_sec;
  speedstore[uVar16].stamp.tv_usec = cVar22.tv_usec;
  if (speedindex < 10) {
    if (indexwrapped != '\x01') {
      uVar5 = start->tv_sec;
      uVar6 = start->tv_usec;
      older_02.tv_usec = uVar6;
      older_02.tv_sec = uVar5;
      cVar22._12_4_ = 0;
      cVar22.tv_sec = auVar1._0_8_;
      cVar22.tv_usec = auVar1._8_4_;
      older_02._12_4_ = 0;
      lVar13 = curlx_timediff(cVar22,older_02);
      lVar12 = bytes;
      lVar14 = bytes_00;
      goto LAB_0011b449;
    }
  }
  else {
    indexwrapped = '\x01';
    speedindex = 0;
  }
  uVar8 = speedstore[speedindex].stamp.tv_sec;
  uVar9 = speedstore[speedindex].stamp.tv_usec;
  older_01.tv_usec = uVar9;
  older_01.tv_sec = uVar8;
  newer_01._12_4_ = 0;
  newer_01.tv_sec = auVar1._0_8_;
  newer_01.tv_usec = auVar1._8_4_;
  older_01._12_4_ = 0;
  lVar13 = curlx_timediff(newer_01,older_01);
  lVar12 = bytes - speedstore[speedindex].ul;
  lVar14 = bytes_00 - speedstore[speedindex].dl;
LAB_0011b449:
  dVar21 = (double)(long)(lVar13 + (ulong)(lVar13 == 0)) / 1000.0;
  lVar14 = (long)((double)lVar14 / dVar21);
  lVar12 = (long)((double)lVar12 / dVar21);
  if (lVar12 < lVar14) {
    lVar12 = lVar14;
  }
  if ((bool)(bVar7 & lVar12 != 0)) {
    lVar14 = all_dltotal / lVar12;
    time2str(time_left,(all_dltotal - bytes_00) / lVar12);
    time2str(time_total,lVar14);
  }
  else {
    builtin_strncpy(time_left,"--:--:--",9);
    builtin_strncpy(time_total,"--:--:--",9);
  }
  time2str(time_spent,tVar11 / 1000);
  pFVar10 = tool_stderr;
  max5data(bytes_00,buffer[0]);
  max5data(bytes,buffer[1]);
  cVar15 = all_xfers;
  max5data(lVar12,buffer[2]);
  pcVar19 = "";
  if (final) {
    pcVar19 = "\n";
  }
  curl_mfprintf(pFVar10,"\r%-3s %-3s %s %s %5ld %5ld  %s %s %s %s %5s",dlpercen,ulpercen,buffer,
                buffer + 1,cVar15,lVar20,time_total,time_spent,time_left,buffer + 2,pcVar19);
  return true;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct curltime *start,
                    bool final)
{
  static struct curltime stamp;
  static bool header = FALSE;
  struct curltime now;
  timediff_t diff;

  if(global->noprogress || global->silent)
    return FALSE;

  now = curlx_now();
  diff = curlx_timediff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live "
          "Total     Current  Left    Speed\n",
          tool_stderr);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = curlx_timediff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(per->added)
        all_running++;
    }
    if(dlknown && all_dltotal)
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow < (CURL_OFF_T_MAX/100) ?
                (all_dlnow * 100 / all_dltotal) :
                (all_dlnow / (all_dltotal/100)));

    if(ulknown && all_ultotal)
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow < (CURL_OFF_T_MAX/100) ?
                (all_ulnow * 100 / all_ultotal) :
                (all_ulnow / (all_ultotal/100)));

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      timediff_t deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = curlx_timediff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = curlx_timediff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      if(!deltams) /* no division by zero please */
        deltams++;
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(tool_stderr,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            " %s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}